

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

EndpointInfo * __thiscall
helics::InterfaceInfo::getEndpoint(InterfaceInfo *this,InterfaceHandle handle)

{
  EndpointInfo *pEVar1;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *this_00;
  InterfaceHandle *in_stack_ffffffffffffffd0;
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *in_stack_ffffffffffffffd8;
  
  this_00 = (shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
             *)&stack0xffffffffffffffd8;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock_shared(this_00);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::operator->((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)this_00);
  pEVar1 = gmlc::containers::
           DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              *)0x5c2c9e);
  return pEVar1;
}

Assistant:

const EndpointInfo* InterfaceInfo::getEndpoint(InterfaceHandle handle) const
{
    return endpoints.lock_shared()->find(handle);
}